

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

bool __thiscall QWidgetWindow::event(QWidgetWindow *this,QEvent *event)

{
  QPointer<QWidget> *this_00;
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  undefined1 uVar4;
  ushort uVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QAccessibleStateChangeEvent ev;
  code *local_58;
  undefined1 *puStack_50;
  QObject *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_widget;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar2) {
LAB_003135cc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      uVar4 = QWindow::event((QEvent *)this);
      return (bool)uVar4;
    }
    goto LAB_00313629;
  }
  uVar5 = *(ushort *)(event + 8);
  switch(uVar5) {
  case 2:
  case 3:
  case 4:
  case 5:
    handleMouseEvent(this,(QMouseEvent *)event);
    break;
  case 6:
  case 7:
switchD_00313320_caseD_6:
    handleKeyEvent(this,(QKeyEvent *)event);
    break;
  case 8:
    handleFocusInEvent(this,(QFocusEvent *)event);
  case 9:
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      local_48 = (QObject *)0x0;
    }
    else {
      local_48 = (this->m_widget).wp.value;
    }
    uStack_40 = 0xaaaaaaaaffffffff;
    local_58 = QCss::ValueExtractor::extractGeometry;
    local_38 = 0x40000000;
    puStack_50 = (undefined1 *)0xaaaaaaaa0000800a;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_58);
    bVar2 = false;
    goto LAB_0031360c;
  case 10:
  case 0xb:
    handleEnterLeaveEvent(this,event);
    break;
  case 0xc:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
switchD_00313341_caseD_c6:
    if ((((0x3b < uVar5 - 0xc) || ((0x9000000000000e1U >> ((ulong)(uVar5 - 0xc) & 0x3f) & 1) == 0))
        && (uVar5 != 1)) && (uVar5 != 0xaa)) {
LAB_0031355d:
      pDVar1 = (this_00->wp).d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (this->m_widget).wp.value;
      }
      cVar3 = QCoreApplication::forwardEvent(pQVar6,event,(QEvent *)0x0);
      bVar2 = true;
      if (cVar3 != '\0') goto LAB_0031360c;
    }
    goto LAB_003135cc;
  case 0xd:
    handleMoveEvent(this,(QMoveEvent *)event);
    break;
  case 0xe:
    handleResizeEvent(this,(QResizeEvent *)event);
    break;
  case 0x17:
    bVar2 = true;
    if (QApplicationPrivate::focus_widget != (QWidget *)0x0) {
      if ((QApplicationPrivate::focus_widget->data->widget_attributes & 0x4000) != 0) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
      }
      QCoreApplication::forwardEvent
                (&QApplicationPrivate::focus_widget->super_QObject,event,(QEvent *)0x0);
    }
    goto LAB_0031360c;
  case 0x1f:
    handleWheelEvent(this,(QWheelEvent *)event);
    break;
  default:
    switch(uVar5) {
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xd1:
      handleTouchEvent(this,(QTouchEvent *)event);
      break;
    case 0xc5:
      handleGestureEvent(this,(QNativeGestureEvent *)event);
      break;
    case 0xc6:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xcf:
    case 0xd0:
      goto switchD_00313341_caseD_c6;
    case 0xce:
      handleExposeEvent(this,(QExposeEvent *)event);
      break;
    case 0xd2:
      local_58 = (code *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,ThemeChange);
      pDVar1 = (this_00->wp).d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (this->m_widget).wp.value;
      }
      QCoreApplication::forwardEvent(pQVar6,(QEvent *)&local_58,event);
      QEvent::~QEvent((QEvent *)&local_58);
      break;
    default:
      switch(uVar5) {
      case 0x3c:
        handleDragEnterEvent(this,(QDragMoveEvent *)event,(QWidget *)0x0);
        break;
      case 0x3d:
        handleDragMoveEvent(this,(QDragMoveEvent *)event);
        break;
      case 0x3e:
        handleDragLeaveEvent(this,(QDragLeaveEvent *)event);
        break;
      case 0x3f:
        handleDropEvent(this,(QDropEvent *)event);
        break;
      default:
        if (uVar5 - 0xad < 4) {
          handleNonClientAreaMouseEvent(this,(QMouseEvent *)event);
          break;
        }
        if (uVar5 - 0x5c < 2) {
LAB_00313397:
          handleTabletEvent(this,(QTabletEvent *)event);
          break;
        }
        if (uVar5 == 0x33) goto switchD_00313320_caseD_6;
        if (uVar5 == 0x4d) {
          QWidget::repaint((QWidget *)(this->m_widget).wp.value);
          break;
        }
        if (uVar5 == 0x52) {
          handleContextMenuEvent(this,(QContextMenuEvent *)event);
          break;
        }
        if (uVar5 == 0x57) goto LAB_00313397;
        if (uVar5 != 0x67) {
          if (uVar5 != 0x69) {
            if (uVar5 == 0xde) {
              handleDevicePixelRatioChange(this);
            }
            else {
              if (uVar5 != 0xe3) goto switchD_00313341_caseD_c6;
              QWidgetPrivate::updateContentsRect
                        (*(QWidgetPrivate **)((this->m_widget).wp.value + 8));
            }
            uVar5 = *(ushort *)(event + 8);
            goto switchD_00313341_caseD_c6;
          }
          QWindow::event((QEvent *)this);
          handleWindowStateChangedEvent(this,(QWindowStateChangeEvent *)event);
          break;
        }
        qt_button_down = (QWidget *)0x0;
        goto LAB_0031355d;
      }
    }
  }
  bVar2 = true;
LAB_0031360c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
LAB_00313629:
  __stack_chk_fail();
}

Assistant:

bool QWidgetWindow::event(QEvent *event)
{
    if (!m_widget)
        return QWindow::event(event);

    switch (event->type()) {
    case QEvent::Enter:
    case QEvent::Leave:
        handleEnterLeaveEvent(event);
        return true;

    // these should not be sent to QWidget, the corresponding events
    // are sent by QApplicationPrivate::notifyActiveWindowChange()
    case QEvent::FocusIn:
        handleFocusInEvent(static_cast<QFocusEvent *>(event));
        Q_FALLTHROUGH();
    case QEvent::FocusOut: {
#if QT_CONFIG(accessibility)
        QAccessible::State state;
        state.active = true;
        QAccessibleStateChangeEvent ev(m_widget, state);
        QAccessible::updateAccessibility(&ev);
#endif
        return false; }

    case QEvent::FocusAboutToChange:
        if (QApplicationPrivate::focus_widget) {
            if (QApplicationPrivate::focus_widget->testAttribute(Qt::WA_InputMethodEnabled))
                QGuiApplication::inputMethod()->commit();

            QGuiApplication::forwardEvent(QApplicationPrivate::focus_widget, event);
        }
        return true;

    case QEvent::KeyPress:
    case QEvent::KeyRelease:
    case QEvent::ShortcutOverride:
        handleKeyEvent(static_cast<QKeyEvent *>(event));
        return true;

    case QEvent::MouseMove:
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
        handleMouseEvent(static_cast<QMouseEvent *>(event));
        return true;

    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
    case QEvent::NonClientAreaMouseButtonDblClick:
        handleNonClientAreaMouseEvent(static_cast<QMouseEvent *>(event));
        return true;

    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    case QEvent::TouchCancel:
        handleTouchEvent(static_cast<QTouchEvent *>(event));
        return true;

    case QEvent::Move:
        handleMoveEvent(static_cast<QMoveEvent *>(event));
        return true;

    case QEvent::Resize:
        handleResizeEvent(static_cast<QResizeEvent *>(event));
        return true;

#if QT_CONFIG(wheelevent)
    case QEvent::Wheel:
        handleWheelEvent(static_cast<QWheelEvent *>(event));
        return true;
#endif

#if QT_CONFIG(draganddrop)
    case QEvent::DragEnter:
        handleDragEnterEvent(static_cast<QDragEnterEvent *>(event));
        return true;
    case QEvent::DragMove:
        handleDragMoveEvent(static_cast<QDragMoveEvent *>(event));
        return true;
    case QEvent::DragLeave:
        handleDragLeaveEvent(static_cast<QDragLeaveEvent *>(event));
        return true;
    case QEvent::Drop:
        handleDropEvent(static_cast<QDropEvent *>(event));
        return true;
#endif

    case QEvent::Expose:
        handleExposeEvent(static_cast<QExposeEvent *>(event));
        return true;

    case QEvent::WindowStateChange:
        QWindow::event(event); // Update QWindow::Visibility and emit signals.
        handleWindowStateChangedEvent(static_cast<QWindowStateChangeEvent *>(event));
        return true;

    case QEvent::ThemeChange: {
        QEvent widgetEvent(QEvent::ThemeChange);
        QCoreApplication::forwardEvent(m_widget, &widgetEvent, event);
    }
        return true;

#if QT_CONFIG(tabletevent)
    case QEvent::TabletPress:
    case QEvent::TabletMove:
    case QEvent::TabletRelease:
        handleTabletEvent(static_cast<QTabletEvent *>(event));
        return true;
#endif

#ifndef QT_NO_GESTURES
    case QEvent::NativeGesture:
        handleGestureEvent(static_cast<QNativeGestureEvent *>(event));
        return true;
#endif

#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        handleContextMenuEvent(static_cast<QContextMenuEvent *>(event));
        return true;
#endif // QT_NO_CONTEXTMENU

    case QEvent::WindowBlocked:
        qt_button_down = nullptr;
        break;

    case QEvent::UpdateRequest:
        // This is not the same as an UpdateRequest for a QWidget. That just
        // syncs the backing store while here we also must mark as dirty.
        m_widget->repaint();
        return true;

    case QEvent::DevicePixelRatioChange:
        handleDevicePixelRatioChange();
        break;

    case QEvent::SafeAreaMarginsChange:
        QWidgetPrivate::get(m_widget)->updateContentsRect();
        break;

    default:
        break;
    }

    if (shouldBePropagatedToWidget(event) && QCoreApplication::forwardEvent(m_widget, event))
        return true;

    return QWindow::event(event);
}